

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfsubs.cpp
# Opt level: O0

void __thiscall
icu_63::NFSubstitution::NFSubstitution
          (NFSubstitution *this,int32_t _pos,NFRuleSet *_ruleSet,UnicodeString *description,
          UErrorCode *status)

{
  UBool UVar1;
  char16_t cVar2;
  char16_t cVar3;
  int32_t iVar4;
  RuleBasedNumberFormat *pRVar5;
  NFRuleSet *pNVar6;
  DecimalFormatSymbols *symbols;
  DecimalFormat *this_00;
  size_t size;
  DecimalFormat *local_108;
  DecimalFormat *tempNumberFormat;
  DecimalFormatSymbols *sym;
  undefined1 local_70 [8];
  UnicodeString workingDescription;
  UErrorCode *status_local;
  UnicodeString *description_local;
  NFRuleSet *_ruleSet_local;
  int32_t _pos_local;
  NFSubstitution *this_local;
  
  workingDescription.fUnion._48_8_ = status;
  UObject::UObject(&this->super_UObject);
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__NFSubstitution_0049f050;
  this->pos = _pos;
  this->ruleSet = (NFRuleSet *)0x0;
  this->numberFormat = (DecimalFormat *)0x0;
  UnicodeString::UnicodeString((UnicodeString *)local_70,description);
  iVar4 = UnicodeString::length(description);
  if (iVar4 < 2) {
LAB_002c8b30:
    iVar4 = UnicodeString::length(description);
    if (iVar4 != 0) {
      *(undefined4 *)workingDescription.fUnion._48_8_ = 9;
      goto LAB_002c8dfc;
    }
  }
  else {
    cVar2 = UnicodeString::charAt(description,0);
    iVar4 = UnicodeString::length(description);
    cVar3 = UnicodeString::charAt(description,iVar4 + -1);
    if (cVar2 != cVar3) goto LAB_002c8b30;
    iVar4 = UnicodeString::length(description);
    UnicodeString::remove((UnicodeString *)local_70,(char *)(ulong)(iVar4 - 1));
    UnicodeString::remove((UnicodeString *)local_70,(char *)0x0);
  }
  iVar4 = UnicodeString::length((UnicodeString *)local_70);
  if (iVar4 == 0) {
    this->ruleSet = _ruleSet;
  }
  else {
    cVar2 = UnicodeString::charAt((UnicodeString *)local_70,0);
    if (cVar2 == L'%') {
      pRVar5 = NFRuleSet::getOwner(_ruleSet);
      pNVar6 = RuleBasedNumberFormat::findRuleSet
                         (pRVar5,(UnicodeString *)local_70,
                          (UErrorCode *)workingDescription.fUnion._48_8_);
      this->ruleSet = pNVar6;
    }
    else {
      size = 0;
      cVar2 = UnicodeString::charAt((UnicodeString *)local_70,0);
      if (cVar2 != L'#') {
        size = 0;
        cVar2 = UnicodeString::charAt((UnicodeString *)local_70,0);
        if (cVar2 != L'0') {
          cVar2 = UnicodeString::charAt((UnicodeString *)local_70,0);
          if (cVar2 == L'>') {
            this->ruleSet = _ruleSet;
            this->numberFormat = (DecimalFormat *)0x0;
          }
          else {
            *(undefined4 *)workingDescription.fUnion._48_8_ = 9;
          }
          goto LAB_002c8dfc;
        }
      }
      pRVar5 = NFRuleSet::getOwner(_ruleSet);
      symbols = RuleBasedNumberFormat::getDecimalFormatSymbols(pRVar5);
      if (symbols == (DecimalFormatSymbols *)0x0) {
        *(undefined4 *)workingDescription.fUnion._48_8_ = 2;
      }
      else {
        this_00 = (DecimalFormat *)UMemory::operator_new((UMemory *)0x170,size);
        local_108 = (DecimalFormat *)0x0;
        if (this_00 != (DecimalFormat *)0x0) {
          DecimalFormat::DecimalFormat
                    (this_00,(UnicodeString *)local_70,symbols,
                     (UErrorCode *)workingDescription.fUnion._48_8_);
          local_108 = this_00;
        }
        if (local_108 == (DecimalFormat *)0x0) {
          *(undefined4 *)workingDescription.fUnion._48_8_ = 7;
        }
        else {
          UVar1 = ::U_FAILURE(*(UErrorCode *)workingDescription.fUnion._48_8_);
          if (UVar1 == '\0') {
            this->numberFormat = local_108;
          }
          else if (local_108 != (DecimalFormat *)0x0) {
            (*(local_108->super_NumberFormat).super_Format.super_UObject._vptr_UObject[1])();
          }
        }
      }
    }
  }
LAB_002c8dfc:
  UnicodeString::~UnicodeString((UnicodeString *)local_70);
  return;
}

Assistant:

NFSubstitution::NFSubstitution(int32_t _pos,
                               const NFRuleSet* _ruleSet,
                               const UnicodeString& description,
                               UErrorCode& status)
                               : pos(_pos), ruleSet(NULL), numberFormat(NULL)
{
    // the description should begin and end with the same character.
    // If it doesn't that's a syntax error.  Otherwise,
    // makeSubstitution() was the only thing that needed to know
    // about these characters, so strip them off
    UnicodeString workingDescription(description);
    if (description.length() >= 2
        && description.charAt(0) == description.charAt(description.length() - 1))
    {
        workingDescription.remove(description.length() - 1, 1);
        workingDescription.remove(0, 1);
    }
    else if (description.length() != 0) {
        // throw new IllegalArgumentException("Illegal substitution syntax");
        status = U_PARSE_ERROR;
        return;
    }

    if (workingDescription.length() == 0) {
        // if the description was just two paired token characters
        // (i.e., "<<" or ">>"), it uses the rule set it belongs to to
        // format its result
        this->ruleSet = _ruleSet;
    }
    else if (workingDescription.charAt(0) == gPercent) {
        // if the description contains a rule set name, that's the rule
        // set we use to format the result: get a reference to the
        // names rule set
        this->ruleSet = _ruleSet->getOwner()->findRuleSet(workingDescription, status);
    }
    else if (workingDescription.charAt(0) == gPound || workingDescription.charAt(0) ==gZero) {
        // if the description begins with 0 or #, treat it as a
        // DecimalFormat pattern, and initialize a DecimalFormat with
        // that pattern (then set it to use the DecimalFormatSymbols
        // belonging to our formatter)
        const DecimalFormatSymbols* sym = _ruleSet->getOwner()->getDecimalFormatSymbols();
        if (!sym) {
            status = U_MISSING_RESOURCE_ERROR;
            return;
        }
        DecimalFormat *tempNumberFormat = new DecimalFormat(workingDescription, *sym, status);
        /* test for NULL */
        if (!tempNumberFormat) {
            status = U_MEMORY_ALLOCATION_ERROR;
            return;
        }
        if (U_FAILURE(status)) {
            delete tempNumberFormat;
            return;
        }
        this->numberFormat = tempNumberFormat;
    }
    else if (workingDescription.charAt(0) == gGreaterThan) {
        // if the description is ">>>", this substitution bypasses the
        // usual rule-search process and always uses the rule that precedes
        // it in its own rule set's rule list (this is used for place-value
        // notations: formats where you want to see a particular part of
        // a number even when it's 0)

        // this causes problems when >>> is used in a frationalPartSubstitution
        // this->ruleSet = NULL;
        this->ruleSet = _ruleSet;
        this->numberFormat = NULL;
    }
    else {
        // and of the description is none of these things, it's a syntax error

        // throw new IllegalArgumentException("Illegal substitution syntax");
        status = U_PARSE_ERROR;
    }
}